

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

Gia_Man_t * Gia_ManSweepHierarchy(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  int iLit0;
  int v;
  
  p_00 = Vec_IntStart(p->nObjs);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_01);
  for (v = 1; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsBuf(pObj);
    if (iVar1 == 0) {
      uVar2 = (uint)*(ulong *)pObj;
      uVar7 = *(ulong *)pObj & 0x1fffffff;
      if (uVar7 == 0x1fffffff || (int)uVar2 < 0) {
        if ((~uVar2 & 0x9fffffff) == 0) {
          uVar2 = Gia_ManAppendCi(p_01);
        }
        else {
          if (-1 < (int)uVar2 || (int)uVar7 == 0x1fffffff) goto LAB_001ca3d3;
          iVar1 = Gia_ObjFanin0Copy(pObj);
          uVar2 = Gia_ManAppendCo(p_01,iVar1);
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pObj);
        uVar2 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
        iVar3 = Abc_LitNotCond(pObj[-(ulong)(uVar2 & 0x1fffffff)].Value,uVar2 >> 0x1d & 1);
        uVar2 = Gia_ManHashAnd(p_01,iVar1,iVar3);
      }
      pObj->Value = uVar2;
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pObj);
      uVar2 = Gia_ManAppendBuf(p_01,iVar1);
      pObj->Value = uVar2;
      iVar1 = Abc_Lit2Var(uVar2);
      pObj_00 = Gia_ManObj(p_01,iVar1);
      iVar1 = Gia_ObjFaninId0p(p_01,pObj_00);
      if (iVar1 == 0) {
        uVar2 = *(uint *)pObj_00 >> 0x1d & 1;
      }
      else {
        iVar3 = Vec_IntEntry(p_00,iVar1);
        if (iVar3 == 0) {
          iVar3 = Gia_ObjId(p_01,pObj_00);
          Vec_IntWriteEntry(p_00,iVar1,iVar3);
          goto LAB_001ca3d3;
        }
        iVar3 = Vec_IntEntry(p_00,iVar1);
        pGVar5 = Gia_ManObj(p_01,iVar3);
        iVar1 = Vec_IntEntry(p_00,iVar1);
        uVar2 = Abc_Var2Lit(iVar1,(*(uint *)pObj_00 ^ *(uint *)pGVar5) >> 0x1d & 1);
      }
      pObj->Value = uVar2;
      iVar1 = Gia_ObjId(p_01,pObj_00);
      Gia_ManPatchBufDriver(p_01,iVar1,iLit0);
    }
LAB_001ca3d3:
  }
  Gia_ManHashStop(p_01);
  Gia_ManSetRegNum(p_01,p->nRegs);
  pGVar6 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  Vec_IntFree(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManSweepHierarchy( Gia_Man_t * p )
{
    Vec_Int_t * vMap = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjNew, * pObjNewR;
    int i, iFanin, CountReals[2] = {0};

    // duplicate AIG while propagating constants and equivalences 
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
            iFanin = Gia_ObjFaninId0p( pNew, pObjNew );
            if ( iFanin == 0 )
            {
                pObj->Value = Gia_ObjFaninC0(pObjNew);
                CountReals[0]++;
                Gia_ManPatchBufDriver( pNew, Gia_ObjId(pNew, pObjNew), 0 );
            }
            else if ( Vec_IntEntry(vMap, iFanin) )
            {
                pObjNewR = Gia_ManObj( pNew, Vec_IntEntry(vMap, iFanin) );
                pObj->Value = Abc_Var2Lit( Vec_IntEntry(vMap, iFanin), Gia_ObjFaninC0(pObjNewR) ^ Gia_ObjFaninC0(pObjNew) );
                CountReals[1]++;
                Gia_ManPatchBufDriver( pNew, Gia_ObjId(pNew, pObjNew), 0 );
            }
            else
                Vec_IntWriteEntry( vMap, iFanin, Gia_ObjId(pNew, pObjNew) );
        }
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    printf( "Updated %d const and %d shared.\n", CountReals[0], CountReals[1] );
    Vec_IntFree( vMap );
    return pNew;
}